

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void wallet::NotifyWalletLoaded(WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  pointer *__ptr;
  _List_node_base *p_Var1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  long *local_48;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_40,&context->wallets_mutex,
             "context.wallets_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xde,false);
  p_Var1 = (_List_node_base *)&context->wallet_load_fns;
  while (p_Var1 = (((_List_base<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>,_std::allocator<std::function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&context->wallet_load_fns) {
    interfaces::MakeWallet((interfaces *)&local_48,context,(shared_ptr<wallet::CWallet> *)wallet);
    std::
    function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>::
    operator()((function<void_(std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)>
                *)(p_Var1 + 1),
               (unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>)&local_48);
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    local_48 = (long *)0x0;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void NotifyWalletLoaded(WalletContext& context, const std::shared_ptr<CWallet>& wallet)
{
    LOCK(context.wallets_mutex);
    for (auto& load_wallet : context.wallet_load_fns) {
        load_wallet(interfaces::MakeWallet(context, wallet));
    }
}